

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtree.c
# Opt level: O0

comp_quest_t *
mk_comp_quest(float64 *wt_ent_dec,float32 ****mixw,float32 ****means,float32 ****vars,uint32 *veclen
             ,uint32 n_model,uint32 n_state,uint32 n_stream,uint32 n_density,float32 *stwt,
             uint32 *id,uint32 n_id,quest_t *all_q,uint32 n_all_q,pset_t *pset,uint32 n_base_phone,
             uint32 **dfeat,uint32 n_dfeat,uint32 split_min,uint32 split_max,float32 split_thr,
             float32 mwfloor)

{
  comp_quest_t *local_88;
  comp_quest_t *q;
  uint32 n_b;
  uint32 n_a;
  dtree_t *tr;
  float32 local_68;
  float32 mwfloor_local;
  float32 split_thr_local;
  uint32 n_model_local;
  uint32 *veclen_local;
  float32 ****vars_local;
  float32 ****means_local;
  float32 ****mixw_local;
  float64 *wt_ent_dec_local;
  
  tr._4_4_ = mwfloor;
  local_68 = split_thr;
  mwfloor_local = (float32)n_model;
  _split_thr_local = veclen;
  veclen_local = (uint32 *)vars;
  vars_local = means;
  means_local = mixw;
  mixw_local = (float32 ****)wt_ent_dec;
  _n_b = mk_tree(mixw,means,vars,veclen,n_model,n_state,n_stream,n_density,stwt,id,n_id,all_q,
                 n_all_q,pset,dfeat,n_dfeat,split_min,split_max,split_thr,mwfloor);
  if (_n_b == (dtree_t *)0x0) {
    *mixw_local = (float32 ***)0x0;
    wt_ent_dec_local = (float64 *)0x0;
  }
  else {
    print_tree(_stderr,"s>",_n_b->node,pset,1);
    cluster_leaves(_n_b,_split_thr_local,(float64 *)mixw_local,(uint32 *)((long)&q + 4),(uint32 *)&q
                   ,pset,n_state,n_stream,n_density,stwt,tr._4_4_);
    if (q._4_4_ < (uint)q) {
      local_88 = tree2quest(_n_b,pset,split_max,1,q._4_4_);
    }
    else {
      local_88 = tree2quest(_n_b,pset,split_max,0,(uint)q);
    }
    free_tree(_n_b);
    simplify_comp_quest(local_88,n_base_phone);
    wt_ent_dec_local = (float64 *)local_88;
  }
  return (comp_quest_t *)wt_ent_dec_local;
}

Assistant:

comp_quest_t *
mk_comp_quest(float64 *wt_ent_dec,
	      float32 ****mixw,
              float32 ****means,
              float32 ****vars,
              uint32  *veclen,
	      uint32 n_model,
	      uint32 n_state,
	      uint32 n_stream,
	      uint32 n_density,
	      float32 *stwt,
	
	      uint32 *id,
	      uint32 n_id,

	      quest_t *all_q,
	      uint32 n_all_q,
	      pset_t *pset,
	      uint32 n_base_phone,

	      uint32 **dfeat,
	      uint32 n_dfeat,
	      
	      uint32 split_min,
	      uint32 split_max,
	      float32 split_thr,

	      float32 mwfloor)
{
    dtree_t *tr;
    uint32 n_a, n_b;
    comp_quest_t *q;

    tr = mk_tree(mixw, means, vars, veclen, 
                 n_model, n_state, n_stream, n_density, stwt,
		 id, n_id,
		 all_q, n_all_q, pset,
		 dfeat, n_dfeat,
		 split_min, split_max, split_thr,
		 mwfloor);

    if (tr == NULL) {
	*wt_ent_dec = 0;
	return NULL;
    }

    print_tree(stderr, "s>", &tr->node[0], pset, 1);

    /* Note that the tree now contains both mixw and mean and var info
       so they no longer need to be passed */
    cluster_leaves(tr, veclen, wt_ent_dec, &n_a, &n_b,
		   pset,
		   n_state, n_stream, n_density, stwt,
		   mwfloor);

    /* Build the disjunction w/ the fewest terms */
    if (n_b > n_a) {
	q = tree2quest(tr, pset, split_max, 1, n_a);
    }
    else {
	q = tree2quest(tr, pset, split_max, 0, n_b);
    }

    free_tree(tr);

    if (simplify_comp_quest(q, n_base_phone)) {
    }

    return q;
}